

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O0

int KINLinSolDrv(KINMem kin_mem)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  long in_RDI;
  int retval;
  N_Vector b;
  N_Vector x;
  
  if (*(long *)(in_RDI + 0x40) <= *(long *)(in_RDI + 0xd0) - *(long *)(in_RDI + 0xe0)) {
    *(undefined8 *)(in_RDI + 200) = 0x4000000000000000;
    *(undefined4 *)(in_RDI + 0x74) = 1;
  }
  while( true ) {
    *(undefined4 *)(in_RDI + 100) = 0;
    if ((1.5 < *(double *)(in_RDI + 200)) && (*(long *)(in_RDI + 0x228) != 0)) {
      iVar3 = (**(code **)(in_RDI + 0x228))(in_RDI);
      *(undefined4 *)(in_RDI + 100) = 1;
      *(undefined8 *)(in_RDI + 0xe0) = *(undefined8 *)(in_RDI + 0xd0);
      *(undefined8 *)(in_RDI + 0xe8) = *(undefined8 *)(in_RDI + 0xd0);
      if (iVar3 != 0) {
        return -0xb;
      }
    }
    uVar1 = *(undefined8 *)(in_RDI + 0x110);
    uVar2 = *(undefined8 *)(in_RDI + 0x138);
    N_VScale(&DAT_bff0000000000000,*(undefined8 *)(in_RDI + 0x118),uVar1);
    iVar3 = (**(code **)(in_RDI + 0x230))(in_RDI,uVar2,uVar1,in_RDI + 0x268,in_RDI + 0x260);
    if (iVar3 == 0) {
      return 0;
    }
    if (iVar3 < 0) {
      return -0xc;
    }
    if ((*(long *)(in_RDI + 0x228) == 0) || (*(int *)(in_RDI + 100) != 0)) break;
    *(undefined8 *)(in_RDI + 200) = 0x4000000000000000;
  }
  return -9;
}

Assistant:

static int KINLinSolDrv(KINMem kin_mem)
{
  N_Vector x, b;
  int retval;

  if ((kin_mem->kin_nni - kin_mem->kin_nnilset) >= kin_mem->kin_msbset)
  {
    kin_mem->kin_sthrsh           = TWO;
    kin_mem->kin_update_fnorm_sub = SUNTRUE;
  }

  for (;;)
  {
    kin_mem->kin_jacCurrent = SUNFALSE;

    if ((kin_mem->kin_sthrsh > ONEPT5) && (kin_mem->kin_lsetup != NULL))
    {
      retval                   = kin_mem->kin_lsetup(kin_mem);
      kin_mem->kin_jacCurrent  = SUNTRUE;
      kin_mem->kin_nnilset     = kin_mem->kin_nni;
      kin_mem->kin_nnilset_sub = kin_mem->kin_nni;
      if (retval != 0) { return (KIN_LSETUP_FAIL); }
    }

    /* rename vectors for readability */

    b = kin_mem->kin_unew;
    x = kin_mem->kin_pp;

    /* load b with the current value of -fval */

    N_VScale(-ONE, kin_mem->kin_fval, b);

    /* call the generic 'lsolve' routine to solve the system Jx = b */

    retval = kin_mem->kin_lsolve(kin_mem, x, b, &(kin_mem->kin_sJpnorm),
                                 &(kin_mem->kin_sFdotJp));

    if (retval == 0) { return (KIN_SUCCESS); }
    else if (retval < 0) { return (KIN_LSOLVE_FAIL); }
    else if ((kin_mem->kin_lsetup == NULL) || (kin_mem->kin_jacCurrent))
    {
      return (KIN_LINSOLV_NO_RECOVERY);
    }

    /* loop back only if the linear solver setup is in use
       and Jacobian information is not current */

    kin_mem->kin_sthrsh = TWO;
  }
}